

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O0

EVdfg_stone EVdfg_create_sink_stone(EVdfg dfg,char *handler_name)

{
  EVdfg_stone p_Var1;
  EVdfg in_RSI;
  char *in_RDI;
  CManager unaff_retaddr;
  CManager_conflict cm;
  EVdfg_stone ret;
  char *in_stack_ffffffffffffffe8;
  
  IntCManager_lock(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  p_Var1 = INT_EVdfg_create_sink_stone(in_RSI,in_stack_ffffffffffffffe8);
  IntCManager_unlock(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  return p_Var1;
}

Assistant:

extern EVdfg_stone
EVdfg_create_sink_stone ( EVdfg dfg, char *handler_name )
{
	EVdfg_stone ret;
	CManager cm = dfg->master->cm;
	CManager_lock(cm);
	ret = INT_EVdfg_create_sink_stone(dfg, handler_name);
	CManager_unlock(cm);
	return ret;
}